

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimeparser.cpp
# Opt level: O0

void __thiscall QtMWidgets::Section::Section(Section *this,Type t)

{
  Type t_local;
  Section *this_local;
  
  this->type = t;
  this->zeroesAdded = false;
  this->sectionWidth = 0;
  QList<QString>::QList(&this->values);
  this->currentIndex = -1;
  this->offset = 0;
  return;
}

Assistant:

Section::Section( Type t )
	:	type( t )
	,	zeroesAdded( false )
	,	sectionWidth( 0 )
	,	currentIndex( -1 )
	,	offset( 0 )
{
}